

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ForkJoin.H
# Opt level: O0

Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> * __thiscall
amrex::ForkJoin::get_mf_vec(ForkJoin *this,string *name)

{
  Long LVar1;
  MultiFab **ppMVar2;
  ForkJoin *in_RSI;
  string *in_RDI;
  int idx;
  int dim;
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *result;
  key_type *in_stack_ffffffffffffff98;
  MultiFab *in_stack_ffffffffffffffa0;
  undefined4 local_30;
  
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
  ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>_>_>_>
        *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  LVar1 = Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_>::size
                    ((Vector<amrex::ForkJoin::MFFork,_std::allocator<amrex::ForkJoin::MFFork>_> *)
                     0x5a4a30);
  std::allocator<amrex::MultiFab_*>::allocator((allocator<amrex::MultiFab_*> *)0x5a4a52);
  Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
             in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98,
             (allocator_type *)0x5a4a66);
  std::allocator<amrex::MultiFab_*>::~allocator((allocator<amrex::MultiFab_*> *)0x5a4a72);
  for (local_30 = 0; local_30 < (int)LVar1; local_30 = local_30 + 1) {
    in_stack_ffffffffffffffa0 =
         get_mf(in_RSI,in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    ppMVar2 = Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::operator[]
                        ((Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                         in_stack_ffffffffffffffa0,(size_type)in_stack_ffffffffffffff98);
    *ppMVar2 = in_stack_ffffffffffffffa0;
  }
  return (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)in_RDI;
}

Assistant:

Vector<MultiFab *> get_mf_vec (const std::string &name) {
        int dim = data.at(name).size();
        Vector<MultiFab *> result(dim);
        for (int idx = 0; idx < dim; ++idx) {
            result[idx] = &get_mf(name, idx);
        }
        return result;
    }